

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O0

int qc_tcp_connect(QcSocket *socket,char *ip,int port)

{
  int iVar1;
  undefined1 local_34 [8];
  sockaddr_in addr;
  int port_local;
  char *ip_local;
  QcSocket *socket_local;
  
  addr.sin_zero._0_4_ = port;
  unique0x100001a9 = ip;
  if (socket == (QcSocket *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0xbf);
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xbf,"int qc_tcp_connect(QcSocket *, const char *, int)");
  }
  if ((ip == (char *)0x0) &&
     (fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0xc0), stack0xffffffffffffffe0 == (char *)0x0)) {
    __assert_fail("ip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xc0,"int qc_tcp_connect(QcSocket *, const char *, int)");
  }
  if (((int)addr.sin_zero._0_4_ < 1) &&
     (fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0xc1), (int)addr.sin_zero._0_4_ < 1)) {
    __assert_fail("port>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xc1,"int qc_tcp_connect(QcSocket *, const char *, int)");
  }
  local_34._0_2_ = 2;
  local_34._2_2_ = htons(addr.sin_zero._0_2_);
  local_34._4_4_ = inet_addr(stack0xffffffffffffffe0);
  iVar1 = connect(socket->sockfd,(sockaddr *)local_34,0x10);
  if (iVar1 == 0) {
    socket_local._4_4_ = 0;
  }
  else {
    _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
               ,0xc9,"tcp connect failed (ip=%s, port=%d)",stack0xffffffffffffffe0,
               (ulong)(uint)addr.sin_zero._0_4_);
    socket_local._4_4_ = -1;
  }
  return socket_local._4_4_;
}

Assistant:

int qc_tcp_connect(QcSocket *socket, const char* ip, int port)
{
    struct sockaddr_in addr;

    qc_assert(socket);
    qc_assert(ip);
    qc_assert(port>0);

    addr.sin_family = AF_INET;
    addr.sin_port = htons(port);
    addr.sin_addr.s_addr = inet_addr(ip);

    if(0 != connect(socket->sockfd, (struct sockaddr*)&addr, sizeof(addr)))
    {
        qc_perror("tcp connect failed (ip=%s, port=%d)", ip, port);
        return -1;
    }

    return 0;
}